

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AverageTestHbd_Random_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AverageTestHbd_Random_Test> *this)

{
  AverageTest<unsigned_short> *this_00;
  
  WithParamInterface<std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>>::
  parameter_ = &this->parameter_;
  this_00 = (AverageTest<unsigned_short> *)operator_new(0x48);
  anon_unknown.dwarf_171beb8::AverageTest<unsigned_short>::AverageTest(this_00);
  (this_00->super_AverageTestBase<unsigned_short>).super_Test._vptr_Test =
       (_func_int **)&PTR__AverageTest_00f443d0;
  (this_00->
  super_WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__AverageTestHbd_Random_Test_00f44410;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }